

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utypes.h
# Opt level: O2

void __thiscall icu_63::Calendar::computeFields(Calendar *this,UErrorCode *ec)

{
  double dVar1;
  uint uVar2;
  int iVar3;
  long lVar4;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dd;
  double dVar5;
  int32_t dstOffset;
  int32_t rawOffset;
  undefined1 local_38 [16];
  
  if (U_ZERO_ERROR < *ec) {
    return;
  }
  dVar5 = this->fTime;
  (*(this->fZone->super_UObject)._vptr_UObject[6])(this->fZone,0,&rawOffset,&dstOffset,ec);
  uVar2 = 0x80067;
  for (lVar4 = -0x17; lVar4 != 0; lVar4 = lVar4 + 1) {
    this->fStamp[lVar4 + 0x17] = uVar2 & 1 ^ 1;
    *(byte *)((long)this->fStamp + lVar4 + -1) = (byte)(uVar2 & 1) ^ 1;
    uVar2 = uVar2 >> 1;
  }
  dVar5 = dVar5 + (double)(dstOffset + rawOffset);
  dVar1 = uprv_floor_63(dVar5 / 86400000.0);
  local_38._8_4_ = extraout_XMM0_Dc;
  local_38._0_8_ = dVar1;
  local_38._12_4_ = extraout_XMM0_Dd;
  this->fFields[0x14] = (int)dVar1 + 0x253d8c;
  this->fStamp[0x14] = 1;
  this->fIsSet[0x14] = '\x01';
  computeGregorianAndDOWFields(this,(int)dVar1 + 0x253d8c,ec);
  (*(this->super_UObject)._vptr_UObject[0x29])(this,(ulong)(uint)this->fFields[0x14],ec);
  computeWeekFields(this,ec);
  iVar3 = (int)(dVar5 - (double)(int)(double)local_38._0_8_ * 86400000.0);
  this->fFields[0x15] = iVar3;
  this->fFields[0xe] = iVar3 % 1000;
  this->fFields[0xd] =
       (int32_t)((long)((ulong)(uint)((int)((long)iVar3 / 1000) >> 0x1f) << 0x20 |
                       (long)iVar3 / 1000 & 0xffffffffU) % 0x3c);
  this->fFields[0xc] =
       (int32_t)((long)((ulong)(uint)((int)((long)iVar3 / 60000) >> 0x1f) << 0x20 |
                       (long)iVar3 / 60000 & 0xffffffffU) % 0x3c);
  this->fFields[0xb] = (int32_t)((long)iVar3 / 3600000);
  this->fFields[9] = iVar3 / 43200000;
  this->fFields[10] = (int)(short)((short)((long)iVar3 / 3600000) % 0xc);
  this->fFields[0xf] = rawOffset;
  this->fFields[0x10] = dstOffset;
  return;
}

Assistant:

static
    inline UBool U_FAILURE(UErrorCode code) { return (UBool)(code>U_ZERO_ERROR); }